

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O1

void X86_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  unsigned_short uVar5;
  uint uVar6;
  
  uVar5 = insn_find(insns,0x1735,id,&h->insn_cache);
  if (uVar5 == 0) {
    return;
  }
  insn->id = (uint)insns[uVar5].mapid;
  if (h->detail == CS_OPT_OFF) {
    return;
  }
  pcVar2 = insn->detail;
  *(undefined4 *)(pcVar2->regs_read + 8) = *(undefined4 *)(insns[uVar5].regs_use + 8);
  *(undefined8 *)pcVar2->regs_read = *(undefined8 *)insns[uVar5].regs_use;
  uVar6 = count_positive(insns[uVar5].regs_use);
  pcVar2 = insn->detail;
  pcVar2->regs_read_count = (uint8_t)uVar6;
  if (id == 0x935) {
    if (h->mode != CS_MODE_64) {
      pcVar2->regs_write[0] = '\x13';
      insn->detail->regs_write[1] = '\x18';
      uVar4 = '\x02';
      goto LAB_001ab2c9;
    }
LAB_001ab29b:
    *(undefined4 *)(pcVar2->regs_write + 0x10) = *(undefined4 *)(insns[uVar5].regs_mod + 0x10);
    uVar3 = *(undefined8 *)(insns[uVar5].regs_mod + 8);
    *(undefined8 *)pcVar2->regs_write = *(undefined8 *)insns[uVar5].regs_mod;
    *(undefined8 *)(pcVar2->regs_write + 8) = uVar3;
  }
  else {
    if (id == 0x936) {
      if (h->mode != CS_MODE_64) {
        pcVar2->regs_write[0] = '\x13';
        insn->detail->regs_write[1] = '\x16';
        insn->detail->regs_write[2] = '\x18';
        uVar4 = '\x03';
        goto LAB_001ab2c9;
      }
      goto LAB_001ab29b;
    }
    *(undefined4 *)(pcVar2->regs_write + 0x10) = *(undefined4 *)(insns[uVar5].regs_mod + 0x10);
    uVar3 = *(undefined8 *)(insns[uVar5].regs_mod + 8);
    *(undefined8 *)pcVar2->regs_write = *(undefined8 *)insns[uVar5].regs_mod;
    *(undefined8 *)(pcVar2->regs_write + 8) = uVar3;
  }
  uVar6 = count_positive(insns[uVar5].regs_mod);
  uVar4 = (uint8_t)uVar6;
LAB_001ab2c9:
  pcVar2 = insn->detail;
  pcVar2->regs_write_count = uVar4;
  *(undefined8 *)pcVar2->groups = *(undefined8 *)insns[uVar5].groups;
  uVar6 = count_positive(insns[uVar5].groups);
  pcVar2 = insn->detail;
  pcVar2->groups_count = (uint8_t)uVar6;
  if ((insns[uVar5].branch != false) || (insns[uVar5].indirect_branch == true)) {
    pcVar2->groups[uVar6 & 0xff] = '\x01';
    puVar1 = &insn->detail->groups_count;
    *puVar1 = *puVar1 + '\x01';
  }
  uVar6 = insns[uVar5].id - 0x766;
  if (((uVar6 < 5) && ((0x15U >> (uVar6 & 0x1f) & 1) != 0)) &&
     (pcVar2 = insn->detail, *(long *)((long)&pcVar2->field_6 + 0x38) == -0x4e)) {
    pcVar2->groups[pcVar2->groups_count] = '\x04';
    puVar1 = &insn->detail->groups_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

void X86_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			// special cases when regs_write[] depends on arch
			switch(id) {
				default:
					memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
					insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					break;
				case X86_RDTSC:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_EDX;
						insn->detail->regs_write_count = 2;
					}
					break;
				case X86_RDTSCP:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_ECX;
						insn->detail->regs_write[2] = X86_REG_EDX;
						insn->detail->regs_write_count = 3;
					}
					break;
			}

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = X86_GRP_JUMP;
				insn->detail->groups_count++;
			}

			switch (insns[i].id) {
				case X86_OUT8ir:
				case X86_OUT16ir:
				case X86_OUT32ir:
					if (insn->detail->x86.operands[0].imm == -78) {
						// Writing to port 0xb2 causes an SMI on most platforms
						// See: http://cs.gmu.edu/~tr-admin/papers/GMU-CS-TR-2011-8.pdf
						insn->detail->groups[insn->detail->groups_count] = X86_GRP_INT;
						insn->detail->groups_count++;
					}
					break;

				default:
					break;
			}
#endif
		}
	}
}